

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::anon_unknown_36::WebSocketImpl::setUpSendingControlMessage(WebSocketImpl *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 *params;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar1;
  long lVar2;
  SourceLocation location;
  OwnPromiseNode OVar3;
  void *pvVar4;
  OwnPromiseNode *this_00;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3660:44)>
  *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  OwnPromiseNode local_70;
  anon_class_8_1_8991fb9c_for_func local_68;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  code *local_58;
  WebSocket local_50;
  WebSocketErrorHandler WStack_48;
  Disposer *local_40;
  OwnPromiseNode local_38;
  Maybe<kj::EntropySource_&> local_30;
  
  if ((this->sendingControlMessage).ptr.isSet == true) {
    params = &(this->sendingControlMessage).ptr.field_1;
    local_58 = kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3660:44)>
               ::anon_class_8_1_8991fb9c_for_func::operator();
    aVar1 = (this->sendingControlMessage).ptr.field_1;
    lVar2 = *(long *)((long)aVar1 + 8);
    local_68.this = this;
    if (lVar2 == 0 || (ulong)((long)aVar1 - lVar2) < 0x28) {
      pvVar4 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3660:44)>
                     *)((long)pvVar4 + 0x3d8);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::WebSocketImpl::setUpSendingControlMessage()::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::WebSocketImpl::setUpSendingControlMessage()::_lambda()_1_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&params->value,
                 &local_68,&local_58);
      *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
    }
    else {
      *(undefined8 *)((long)aVar1 + 8) = 0;
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3660:44)>
                     *)((long)aVar1 + -0x28);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::WebSocketImpl::setUpSendingControlMessage()::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::WebSocketImpl::setUpSendingControlMessage()::_lambda()_1_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&params->value,
                 &local_68,&local_58);
      *(long *)((long)aVar1 + -0x20) = lVar2;
    }
    local_50._vptr_WebSocket = (_func_int **)&DAT_0042a172;
    WStack_48._vptr_WebSocketErrorHandler = (_func_int **)&DAT_0042a1d1;
    local_40 = (Disposer *)0x4c0000058b;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_60.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<void>(&stack0xffffffffffffffc8,(Promise<void> *)&local_60,location);
    OVar3.ptr = local_38.ptr;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&stack0xffffffffffffffc8);
    local_70.ptr = OVar3.ptr;
    local_30.ptr = (EntropySource *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffd0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
    kj::_::NullableValue<kj::Promise<void>>::emplace<kj::Promise<void>>
              ((NullableValue<kj::Promise<void>> *)&this->sendingControlMessage,
               (Promise<void> *)&local_70);
    this_00 = &local_70;
  }
  else {
    writeQueuedControlMessage((WebSocketImpl *)&stack0xffffffffffffffb0);
    kj::_::NullableValue<kj::Promise<void>>::emplace<kj::Promise<void>>
              ((NullableValue<kj::Promise<void>> *)&this->sendingControlMessage,
               (Promise<void> *)&stack0xffffffffffffffb0);
    this_00 = (OwnPromiseNode *)&stack0xffffffffffffffb0;
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_00);
  return;
}

Assistant:

void setUpSendingControlMessage() {
    KJ_IF_SOME(promise, sendingControlMessage) {
      sendingControlMessage = promise.then([this]() mutable {
        return writeQueuedControlMessage();
      });
    } else {
      sendingControlMessage = writeQueuedControlMessage();
    }
  }